

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  int *piVar1;
  int iVar2;
  uint *puVar3;
  ImGuiID IVar4;
  char *pcVar5;
  size_t sVar6;
  uint *__dest;
  int iVar7;
  int iVar8;
  
  (this->DC).MenuBarOffset.x = 0.0;
  (this->DC).MenuBarOffset.y = 0.0;
  (this->DC).Indent = 0.0;
  (this->DC).ColumnsOffset = 0.0;
  (this->DC).GroupOffset = 0.0;
  (this->DC).CursorStartPosLossyness.x = 0.0;
  (this->DC).CursorStartPosLossyness.y = 0.0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->ContentSize).x = 0.0;
  (this->ContentSize).y = 0.0;
  (this->ContentSizeIdeal).x = 0.0;
  (this->ContentSizeIdeal).y = 0.0;
  (this->ContentSizeExplicit).x = 0.0;
  (this->ContentSizeExplicit).y = 0.0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollMax).x = 0.0;
  (this->ScrollMax).y = 0.0;
  (this->ScrollTarget).x = 0.0;
  (this->ScrollTarget).y = 0.0;
  (this->ScrollTargetCenterRatio).x = 0.0;
  (this->ScrollTargetCenterRatio).y = 0.0;
  (this->ScrollTargetEdgeSnapDist).x = 0.0;
  (this->ScrollTargetEdgeSnapDist).y = 0.0;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  (this->SetWindowPosVal).x = 0.0;
  (this->SetWindowPosVal).y = 0.0;
  (this->SetWindowPosPivot).x = 0.0;
  (this->SetWindowPosPivot).y = 0.0;
  (this->IDStack).Size = 0;
  (this->IDStack).Capacity = 0;
  (this->IDStack).Data = (uint *)0x0;
  (this->DC).CursorPos.x = 0.0;
  (this->DC).CursorPos.y = 0.0;
  (this->DC).CursorPosPrevLine.x = 0.0;
  (this->DC).CursorPosPrevLine.y = 0.0;
  (this->DC).CursorStartPos.x = 0.0;
  (this->DC).CursorStartPos.y = 0.0;
  (this->DC).CursorMaxPos.x = 0.0;
  (this->DC).CursorMaxPos.y = 0.0;
  (this->DC).IdealMaxPos.x = 0.0;
  (this->DC).IdealMaxPos.y = 0.0;
  (this->DC).CurrLineSize.x = 0.0;
  (this->DC).CurrLineSize.y = 0.0;
  (this->DC).PrevLineSize.x = 0.0;
  (this->DC).PrevLineSize.y = 0.0;
  (this->DC).MenuColumns.TotalWidth = 0;
  (this->DC).MenuColumns.NextTotalWidth = 0;
  (this->DC).MenuColumns.Spacing = 0;
  (this->DC).MenuColumns.OffsetIcon = 0;
  (this->DC).MenuColumns.OffsetLabel = 0;
  (this->DC).MenuColumns.OffsetShortcut = 0;
  (this->DC).MenuColumns.OffsetLabel = 0;
  (this->DC).MenuColumns.OffsetShortcut = 0;
  (this->DC).MenuColumns.OffsetMark = 0;
  (this->DC).MenuColumns.Widths[0] = 0;
  *(undefined8 *)((this->DC).MenuColumns.Widths + 1) = 0;
  (this->DC).ChildWindows.Size = 0;
  (this->DC).ChildWindows.Capacity = 0;
  (this->DC).ChildWindows.Data = (ImGuiWindow **)0x0;
  (this->DrawListInst)._Splitter._Channels.Size = 0;
  (this->DrawListInst)._Splitter._Channels.Capacity = 0;
  (this->DrawListInst)._Splitter._Channels.Data = (ImDrawChannel *)0x0;
  (this->DrawListInst).CmdBuffer.Size = 0;
  (this->DrawListInst).CmdBuffer.Capacity = 0;
  (this->DrawListInst).CmdBuffer.Data = (ImDrawCmd *)0x0;
  (this->DrawListInst).IdxBuffer.Size = 0;
  (this->DrawListInst).IdxBuffer.Capacity = 0;
  (this->DrawListInst).IdxBuffer.Data = (unsigned_short *)0x0;
  (this->DrawListInst).VtxBuffer.Size = 0;
  (this->DrawListInst).VtxBuffer.Capacity = 0;
  (this->DrawListInst).VtxBuffer.Data = (ImDrawVert *)0x0;
  (this->DrawListInst)._ClipRectStack.Size = 0;
  (this->DrawListInst)._ClipRectStack.Capacity = 0;
  (this->DrawListInst)._ClipRectStack.Data = (ImVec4 *)0x0;
  (this->DrawListInst)._TextureIdStack.Size = 0;
  (this->DrawListInst)._TextureIdStack.Capacity = 0;
  (this->DrawListInst)._TextureIdStack.Data = (void **)0x0;
  (this->DrawListInst)._Path.Size = 0;
  (this->DrawListInst)._Path.Capacity = 0;
  (this->DrawListInst)._Path.Data = (ImVec2 *)0x0;
  (this->DrawListInst)._CmdHeader.ClipRect.x = 0.0;
  (this->DrawListInst)._CmdHeader.ClipRect.y = 0.0;
  (this->DrawListInst)._CmdHeader.ClipRect.z = 0.0;
  (this->DrawListInst)._CmdHeader.ClipRect.w = 0.0;
  memset(&(this->DC).ItemWidthStack,0,0x98);
  (this->StateStorage).Data.Size = 0;
  (this->StateStorage).Data.Capacity = 0;
  (this->StateStorage).Data.Data = (ImGuiStoragePair *)0x0;
  (this->ColumnsStorage).Size = 0;
  (this->ColumnsStorage).Capacity = 0;
  (this->ColumnsStorage).Data = (ImGuiOldColumns *)0x0;
  (this->DrawListInst)._Splitter._Current = 0;
  (this->DrawListInst)._Splitter._Count = 0;
  (this->DrawListInst)._Splitter._Channels.Size = 0;
  (this->DrawListInst)._Splitter._Channels.Capacity = 0;
  (this->DrawListInst)._Splitter._Channels.Data = (ImDrawChannel *)0x0;
  memset(&this->DrawListInst,0,200);
  (this->DrawListInst)._Data = (ImDrawListSharedData *)0x0;
  this->NavRectRel[0].Min.x = 0.0;
  this->NavRectRel[0].Min.y = 0.0;
  this->NavRectRel[0].Max.x = 0.0;
  this->NavRectRel[0].Max.y = 0.0;
  this->NavRectRel[1].Min.x = 0.0;
  this->NavRectRel[1].Min.y = 0.0;
  this->NavRectRel[1].Max.x = 0.0;
  this->NavRectRel[1].Max.y = 0.0;
  memset(this,0,0x3b8);
  pcVar5 = ImStrdup(name);
  this->Name = pcVar5;
  sVar6 = strlen(name);
  this->NameBufLen = (int)sVar6 + 1;
  IVar4 = ImHashStr(name,0,0);
  this->ID = IVar4;
  iVar8 = (this->IDStack).Size;
  iVar2 = (this->IDStack).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
      puVar3 = (this->IDStack).Data;
      if (puVar3 != (uint *)0x0) {
        memcpy(__dest,puVar3,(long)(this->IDStack).Size << 2);
        puVar3 = (this->IDStack).Data;
        if ((puVar3 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
      }
      (this->IDStack).Data = __dest;
      (this->IDStack).Capacity = iVar8;
    }
  }
  (this->IDStack).Data[(this->IDStack).Size] = this->ID;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  IVar4 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar4;
  (this->ScrollTarget).x = 3.4028235e+38;
  (this->ScrollTarget).y = 3.4028235e+38;
  (this->ScrollTargetCenterRatio).x = 0.5;
  (this->ScrollTargetCenterRatio).y = 0.5;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoPosLastDirection = -1;
  *(uint *)&this->field_0xbc = (uint)(byte)this->field_0xbf << 0x18 | 0xf0f0f;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  (this->SetWindowPosVal).y = 3.4028235e+38;
  (this->SetWindowPosPivot).x = 3.4028235e+38;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  this->LastFrameActive = -1;
  this->LastTimeActive = -1.0;
  this->FontWindowScale = 1.0;
  this->SettingsOffset = -1;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._Data = &context->DrawListSharedData;
  (this->DrawListInst)._OwnerName = this->Name;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name) : DrawListInst(NULL)
{
    memset(this, 0, sizeof(*this));
    Name = ImStrdup(name);
    NameBufLen = (int)strlen(name) + 1;
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    MoveId = GetID("#MOVE");
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoPosLastDirection = ImGuiDir_None;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);
    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    FontWindowScale = 1.0f;
    SettingsOffset = -1;
    DrawList = &DrawListInst;
    DrawList->_Data = &context->DrawListSharedData;
    DrawList->_OwnerName = Name;
}